

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<_drmModeModeInfo>::data(QList<_drmModeModeInfo> *this)

{
  QArrayDataPointer<_drmModeModeInfo> *this_00;
  _drmModeModeInfo *p_Var1;
  QArrayDataPointer<_drmModeModeInfo> *in_RDI;
  
  detach((QList<_drmModeModeInfo> *)0x124fdc);
  this_00 = (QArrayDataPointer<_drmModeModeInfo> *)
            QArrayDataPointer<_drmModeModeInfo>::operator->(in_RDI);
  p_Var1 = QArrayDataPointer<_drmModeModeInfo>::data(this_00);
  return p_Var1;
}

Assistant:

pointer data() { detach(); return d->data(); }